

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfAdjointEigenSolver.h
# Opt level: O2

void __thiscall
Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::SelfAdjointEigenSolver
          (SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,Index size)

{
  long local_30;
  Index local_28;
  Index size_local;
  
  local_28 = size;
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_28,&local_28);
  Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_eivalues,&local_28);
  local_30 = 1;
  if (1 < local_28) {
    local_30 = local_28 + -1;
  }
  Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_subdiag,&local_30);
  this->m_isInitialized = false;
  return;
}

Assistant:

SelfAdjointEigenSolver(Index size)
        : m_eivec(size, size),
          m_eivalues(size),
          m_subdiag(size > 1 ? size - 1 : 1),
          m_isInitialized(false)
    {}